

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O0

Statement * parseState(string *line,bool flag)

{
  code *pcVar1;
  Expression *pEVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  allocator local_5b9;
  string local_5b8 [72];
  string local_570 [39];
  allocator local_549;
  string local_548 [36];
  int local_524;
  undefined1 local_520 [4];
  int lineNumber;
  string s;
  allocator local_4f9;
  string local_4f8 [32];
  string local_4d8 [36];
  int local_4b4;
  string local_4b0 [4];
  int line_number_1;
  string local_490 [39];
  allocator local_469;
  string local_468 [32];
  undefined1 local_448 [64];
  undefined1 local_408 [64];
  undefined1 local_3c8 [40];
  string s2;
  string local_388 [8];
  string s1;
  string local_368 [8];
  string token_1;
  string local_340 [39];
  allocator local_319;
  string local_318 [72];
  string local_2d0 [36];
  int local_2ac;
  undefined1 local_2a8 [4];
  int line_number;
  undefined1 local_288 [8];
  string tmp;
  undefined1 local_268 [8];
  string cmp;
  ErrorException err_2;
  string local_218 [40];
  ErrorException err_1;
  string local_1c8 [32];
  undefined1 local_1a8 [40];
  ErrorException err;
  undefined1 local_158 [32];
  Expression *local_138;
  Expression *exp2;
  Expression *exp1;
  Expression *exp;
  Statement *sta;
  string local_f8 [8];
  string token;
  string local_d8 [8];
  string first_token;
  string local_b8 [48];
  undefined1 local_88 [8];
  TokenScanner scanner;
  bool flag_local;
  string *line_local;
  
  scanner.operators._7_1_ = flag;
  TokenScanner::TokenScanner((TokenScanner *)local_88);
  TokenScanner::ignoreWhitespace((TokenScanner *)local_88);
  TokenScanner::scanNumbers((TokenScanner *)local_88);
  std::__cxx11::string::string(local_b8,(string *)line);
  TokenScanner::setInput((TokenScanner *)local_88,(string *)local_b8);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::string(local_d8);
  std::__cxx11::string::string(local_f8);
  if ((scanner.operators._7_1_ & 1) != 0) {
    TokenScanner::nextToken_abi_cxx11_((TokenScanner *)&sta);
    std::__cxx11::string::operator=(local_d8,(string *)&sta);
    std::__cxx11::string::~string((string *)&sta);
  }
  exp = (Expression *)0x0;
  exp1 = (Expression *)0x0;
  exp2 = (Expression *)0x0;
  local_138 = (Expression *)0x0;
  TokenScanner::nextToken_abi_cxx11_((TokenScanner *)local_158);
  std::__cxx11::string::operator=(local_d8,(string *)local_158);
  std::__cxx11::string::~string((string *)local_158);
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_d8,"LET");
  if (bVar3) {
    line_local = (string *)operator_new(0x10);
    StateLet::StateLet((StateLet *)line_local,(TokenScanner *)local_88);
    err._36_4_ = 1;
    exp = (Expression *)line_local;
  }
  else {
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_d8,"PRINT");
    if (bVar3) {
      exp1 = parseExp((TokenScanner *)local_88);
      iVar4 = (*exp1->_vptr_Expression[4])();
      if (iVar4 == 2) {
        CompoundExp::getOp_abi_cxx11_((CompoundExp *)local_1a8);
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_1a8,"=");
        std::__cxx11::string::~string((string *)local_1a8);
        if (bVar3) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1c8,"SYNTAX ERROR",(allocator *)&err_1.field_0x27);
          error((string *)local_1c8);
          std::__cxx11::string::~string(local_1c8);
          std::allocator<char>::~allocator((allocator<char> *)&err_1.field_0x27);
        }
      }
      line_local = (string *)operator_new(0x10);
      StatePrint::StatePrint((StatePrint *)line_local,exp1);
      err._36_4_ = 1;
      exp = (Expression *)line_local;
    }
    else {
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_d8,"INPUT");
      if (bVar3) {
        exp1 = parseExp((TokenScanner *)local_88);
        iVar4 = (*exp1->_vptr_Expression[4])();
        if (iVar4 != 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_218,"SYNTAX ERROR",(allocator *)&err_2.field_0x27);
          error((string *)local_218);
          std::__cxx11::string::~string(local_218);
          std::allocator<char>::~allocator((allocator<char> *)&err_2.field_0x27);
        }
        line_local = (string *)operator_new(0x10);
        StateInput::StateInput((StateInput *)line_local,exp1);
        err._36_4_ = 1;
      }
      else {
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_d8,"REM");
        if (bVar3) {
          line_local = (string *)operator_new(8);
          StateRem::StateRem((StateRem *)line_local);
          err._36_4_ = 1;
        }
        else {
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_d8,"END");
          if (bVar3) {
            line_local = (string *)operator_new(8);
            StateEnd::StateEnd((StateEnd *)line_local);
            err._36_4_ = 1;
          }
          else {
            bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_d8,"IF");
            if (bVar3) {
              lVar5 = std::__cxx11::string::find((char *)line,0x111057);
              if (lVar5 != -1) {
                std::__cxx11::string::string(local_368);
                std::__cxx11::string::string(local_388);
                std::__cxx11::string::string((string *)(local_3c8 + 0x20));
                while (bVar3 = TokenScanner::hasMoreTokens((TokenScanner *)local_88), bVar3) {
                  TokenScanner::nextToken_abi_cxx11_((TokenScanner *)local_3c8);
                  std::__cxx11::string::operator=(local_368,(string *)local_3c8);
                  std::__cxx11::string::~string((string *)local_3c8);
                  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_368,"=");
                  if (bVar3) break;
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(local_408 + 0x20),(char)local_368);
                  std::__cxx11::string::operator+=(local_388,(string *)(local_408 + 0x20));
                  std::__cxx11::string::~string((string *)(local_408 + 0x20));
                }
                do {
                  bVar3 = TokenScanner::hasMoreTokens((TokenScanner *)local_88);
                  if (!bVar3) goto LAB_0010e4c7;
                  TokenScanner::nextToken_abi_cxx11_((TokenScanner *)local_408);
                  std::__cxx11::string::operator=(local_368,(string *)local_408);
                  std::__cxx11::string::~string((string *)local_408);
                  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_368,"THEN");
                  if (bVar3) goto LAB_0010e4c7;
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(local_448 + 0x20),(char)local_368);
                  std::__cxx11::string::operator+=
                            ((string *)(local_3c8 + 0x20),(string *)(local_448 + 0x20));
                  std::__cxx11::string::~string((string *)(local_448 + 0x20));
                } while( true );
              }
              exp2 = readE((TokenScanner *)local_88,0);
              TokenScanner::nextToken_abi_cxx11_((TokenScanner *)local_268);
              local_138 = readE((TokenScanner *)local_88,0);
              TokenScanner::nextToken_abi_cxx11_((TokenScanner *)local_288);
              TokenScanner::nextToken_abi_cxx11_((TokenScanner *)local_2a8);
              std::__cxx11::string::operator=((string *)local_288,(string *)local_2a8);
              std::__cxx11::string::~string((string *)local_2a8);
              std::__cxx11::string::string(local_2d0,(string *)local_288);
              local_2ac = stringToInteger((string *)local_2d0);
              std::__cxx11::string::~string(local_2d0);
              bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_268,"=");
              if ((((bVar3) &&
                   (bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_268,"<"), bVar3)) &&
                  (bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_268,">"), bVar3)) ||
                 (bVar3 = TokenScanner::hasMoreTokens((TokenScanner *)local_88), bVar3)) {
                if (exp2 != (Expression *)0x0) {
                  (*exp2->_vptr_Expression[1])();
                }
                if (local_138 != (Expression *)0x0) {
                  (*local_138->_vptr_Expression[1])();
                }
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_318,"SYNTAX ERROR",&local_319);
                error((string *)local_318);
                std::__cxx11::string::~string(local_318);
                std::allocator<char>::~allocator((allocator<char> *)&local_319);
              }
              line_local = (string *)operator_new(0x40);
              pEVar2 = exp2;
              std::__cxx11::string::string(local_340,(string *)local_268);
              StateIf::StateIf((StateIf *)line_local,pEVar2,(string *)local_340,local_138,local_2ac)
              ;
              std::__cxx11::string::~string(local_340);
              err._36_4_ = 1;
              std::__cxx11::string::~string((string *)local_288);
              std::__cxx11::string::~string((string *)local_268);
            }
            else {
              bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_d8,"GOTO");
              if (!bVar3) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_5b8,"SYNTAX ERROR",&local_5b9);
                error((string *)local_5b8);
                std::__cxx11::string::~string(local_5b8);
                std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              TokenScanner::nextToken_abi_cxx11_((TokenScanner *)local_520);
              bVar3 = TokenScanner::hasMoreTokens((TokenScanner *)local_88);
              if (bVar3) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_548,"SYNTAX ERROR",&local_549);
                error((string *)local_548);
                std::__cxx11::string::~string(local_548);
                std::allocator<char>::~allocator((allocator<char> *)&local_549);
              }
              std::__cxx11::string::string(local_570,(string *)local_520);
              local_524 = stringToInteger((string *)local_570);
              std::__cxx11::string::~string(local_570);
              line_local = (string *)operator_new(0x10);
              StateGoto::StateGoto((StateGoto *)line_local,local_524);
              err._36_4_ = 1;
              std::__cxx11::string::~string((string *)local_520);
            }
          }
        }
      }
    }
  }
LAB_0010ebbd:
  std::__cxx11::string::~string(local_f8);
  std::__cxx11::string::~string(local_d8);
  TokenScanner::~TokenScanner((TokenScanner *)local_88);
  return (Statement *)line_local;
LAB_0010e4c7:
  bVar3 = TokenScanner::hasMoreTokens((TokenScanner *)local_88);
  if (bVar3) {
    TokenScanner::nextToken_abi_cxx11_((TokenScanner *)local_448);
    std::__cxx11::string::operator=(local_368,(string *)local_448);
    std::__cxx11::string::~string((string *)local_448);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_468,"SYNTAX ERROR",&local_469);
    error((string *)local_468);
    std::__cxx11::string::~string(local_468);
    std::allocator<char>::~allocator((allocator<char> *)&local_469);
  }
  std::__cxx11::string::string(local_490,local_388);
  TokenScanner::setInput((TokenScanner *)local_88,(string *)local_490);
  std::__cxx11::string::~string(local_490);
  exp2 = parseExp((TokenScanner *)local_88);
  std::__cxx11::string::string(local_4b0,(string *)(local_3c8 + 0x20));
  TokenScanner::setInput((TokenScanner *)local_88,(string *)local_4b0);
  std::__cxx11::string::~string(local_4b0);
  local_138 = parseExp((TokenScanner *)local_88);
  std::__cxx11::string::string(local_4d8,local_368);
  iVar4 = stringToInteger((string *)local_4d8);
  std::__cxx11::string::~string(local_4d8);
  local_4b4 = iVar4;
  line_local = (string *)operator_new(0x40);
  pEVar2 = exp2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4f8,"=",&local_4f9);
  StateIf::StateIf((StateIf *)line_local,pEVar2,(string *)local_4f8,local_138,local_4b4);
  std::__cxx11::string::~string(local_4f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
  err._36_4_ = 1;
  std::__cxx11::string::~string((string *)(local_3c8 + 0x20));
  std::__cxx11::string::~string(local_388);
  std::__cxx11::string::~string(local_368);
  goto LAB_0010ebbd;
}

Assistant:

Statement *parseState(string line, bool flag) {
    TokenScanner scanner;
    scanner.ignoreWhitespace();
    scanner.scanNumbers();
    scanner.setInput(line);
    string first_token, token;
    if (flag) {
        first_token = scanner.nextToken();
    }
    Statement *sta = nullptr;
    Expression *exp = nullptr;
    Expression *exp1 = nullptr;
    Expression *exp2 = nullptr;
    first_token = scanner.nextToken();
    if (first_token == "LET") {
        try {
            sta = new StateLet(scanner);
            return sta;
        }
        catch (ErrorException err) {
            if (sta != nullptr) delete sta;
            throw err;
        } catch (...) {

        }
    } else if (first_token == "PRINT") {
        try {
            exp = parseExp(scanner);
            if (exp->getType()==COMPOUND)
                if (((CompoundExp*)exp)->getOp()=="=") error("SYNTAX ERROR");
            sta = new StatePrint(exp);
            return sta;
        } catch (ErrorException err) {
            if (exp != nullptr) delete exp;
            if (sta != nullptr) delete sta;
            throw err;
        }
    } else if (first_token == "INPUT") {
        try {
            exp = parseExp(scanner);
            if (exp->getType() != IDENTIFIER) error("SYNTAX ERROR");
            return new StateInput(exp);
        } catch (ErrorException err) {
            if (exp != nullptr) delete exp;
            throw err;
        } catch (...) {
            if (exp != nullptr) delete exp;
        }
    } else if (first_token == "REM") {
        return new StateRem;
    } else if (first_token == "END") {
        return new StateEnd;
    } else if (first_token == "IF") {
        if (line.find("=") == string::npos) {
            exp1 = readE(scanner);
            string cmp = scanner.nextToken();
            exp2 = readE(scanner);
            string tmp = scanner.nextToken();
            tmp = scanner.nextToken();
            int line_number;
            try {
                line_number = stringToInteger(tmp);
            } catch (...) {
                delete exp1;
                delete exp2;
                error("SYNTAX ERROR");
            }
            if ((cmp != "=" && cmp != "<" && cmp != ">") || scanner.hasMoreTokens()) {
                delete exp1;
                delete exp2;
                error("SYNTAX ERROR");
            }
            return new StateIf(exp1, cmp, exp2, line_number);
        }else {
            string token,s1,s2;
            while (scanner.hasMoreTokens()){
                token=scanner.nextToken();
                if (token=="=") break;
                s1+=token+' ';
            }
            while (scanner.hasMoreTokens()){
                token=scanner.nextToken();
                if (token=="THEN") break;
                s2+=token+' ';
            }
            if (scanner.hasMoreTokens())
                token=scanner.nextToken();
            else error("SYNTAX ERROR");
            scanner.setInput(s1);
            exp1=parseExp(scanner);
            scanner.setInput(s2);
            exp2=parseExp(scanner);
            int line_number=stringToInteger(token);
            return new StateIf(exp1,"=",exp2,line_number);
        }
    } else if (first_token == "GOTO") {
        string s = scanner.nextToken();
        int lineNumber;
        if (scanner.hasMoreTokens()) error("SYNTAX ERROR");
        try {
            lineNumber = stringToInteger(s);
        } catch (...) {
            error("SYNTAX ERROR");
        }
        return new StateGoto(lineNumber);
    } else error("SYNTAX ERROR");
}